

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O2

void __thiscall rapidjson::internal::BigInteger::PushBack(BigInteger *this,Type digit)

{
  ulong uVar1;
  RapidJSONException *this_00;
  
  uVar1 = this->count_;
  if (uVar1 < 0x1a0) {
    this->count_ = uVar1 + 1;
    this->digits_[uVar1] = digit;
    return;
  }
  this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
  cereal::RapidJSONException::RapidJSONException
            (this_00,"rapidjson internal assertion failure: count_ < kCapacity");
  __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PushBack(Type digit) {
        CEREAL_RAPIDJSON_ASSERT(count_ < kCapacity);
        digits_[count_++] = digit;
    }